

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

void __thiscall
gvr::Mesh::Mesh(Mesh *this,Mesh *p,vector<bool,_std::allocator<bool>_> *vused,
               vector<bool,_std::allocator<bool>_> *tused)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  uint *puVar5;
  uint uVar6;
  float *pfVar7;
  uint *puVar8;
  size_type __new_size;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  PointCloud::PointCloud(&this->super_PointCloud,&p->super_PointCloud,vused);
  (this->super_PointCloud).super_Model._vptr_Model = (_func_int **)&PTR__Mesh_00130920;
  lVar3 = (long)(this->super_PointCloud).n;
  uVar10 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar10 = lVar3 * 0xc;
  }
  pfVar4 = (float *)operator_new__(uVar10);
  this->normal = pfVar4;
  __new_size = (size_type)(p->super_PointCloud).n;
  if (0 < (long)__new_size) {
    lVar3 = *(long *)vused;
    pfVar7 = p->normal + 2;
    uVar10 = 0;
    uVar11 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar10 >> 6 & 0x3ffffff) * 8) >> (uVar10 & 0x3f) & 1) != 0) {
        iVar2 = (int)uVar11;
        pfVar4[uVar11] = pfVar7[-2];
        pfVar4[iVar2 + 1] = pfVar7[-1];
        uVar11 = (ulong)(iVar2 + 3);
        pfVar4[iVar2 + 2] = *pfVar7;
      }
      uVar10 = uVar10 + 1;
      pfVar7 = pfVar7 + 3;
    } while (__new_size != uVar10);
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,__new_size);
  iVar2 = (p->super_PointCloud).n;
  if (0 < iVar2) {
    lVar3 = *(long *)vused;
    uVar10 = 0;
    uVar9 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar10 >> 6 & 0x3ffffff) * 8) >> (uVar10 & 0x3f) & 1) != 0) {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = uVar9;
        uVar9 = uVar9 + 1;
        iVar2 = (p->super_PointCloud).n;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)iVar2);
  }
  this->n = 0;
  uVar9 = p->n;
  uVar11 = 0;
  uVar10 = uVar11;
  if (0 < (int)uVar9) {
    lVar3 = *(long *)tused;
    uVar10 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0) {
        uVar9 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar9;
        this->n = uVar9;
        uVar9 = p->n;
      }
      uVar6 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar6;
    } while ((int)uVar6 < (int)uVar9);
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar11) {
      uVar10 = (long)((int)uVar11 * 3) << 2;
    }
  }
  puVar5 = (uint *)operator_new__(uVar10);
  this->triangle = puVar5;
  if (0 < (int)uVar9) {
    lVar3 = *(long *)tused;
    puVar8 = p->triangle + 2;
    uVar10 = 0;
    uVar6 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar10 >> 6 & 0x3ffffff) * 8) >> (uVar10 & 0x3f) & 1) != 0) {
        puVar5[uVar6] =
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar8[-2]];
        uVar1 = uVar6 + 2;
        puVar5[uVar6 + 1] =
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar8[-1]];
        uVar6 = uVar6 + 3;
        puVar5[uVar1] =
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*puVar8];
      }
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 3;
    } while (uVar9 != uVar10);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Mesh::Mesh(const Mesh &p, const std::vector<bool> &vused, const std::vector<bool> &tused)
  : PointCloud(p, vused)
{
  normal=new float [3*getVertexCount()];

  unsigned int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      normal[k++]=p.getNormalComp(i, 0);
      normal[k++]=p.getNormalComp(i, 1);
      normal[k++]=p.getNormalComp(i, 2);
    }
  }

  // adapt indices of triangle vertices

  std::vector<unsigned int> index;
  index.resize(p.getVertexCount());

  k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      index[i]=k++;
    }
  }

  n=0;

  for (int i=0; i<p.getTriangleCount(); i++)
    if (tused[i])
    {
      n++;
    }

  triangle=new unsigned int [3*n];

  k=0;

  for (int i=0; i<p.getTriangleCount(); i++)
  {
    if (tused[i])
    {
      triangle[k++]=index[p.getTriangleIndex(i, 0)];
      triangle[k++]=index[p.getTriangleIndex(i, 1)];
      triangle[k++]=index[p.getTriangleIndex(i, 2)];
    }
  }
}